

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ResultBuilder::captureExpectedException(ResultBuilder *this,string *expectedMessage)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58
  ;
  CasedString local_48;
  
  if (expectedMessage->_M_string_length == 0) {
    local_58.super_SharedImpl<Catch::IShared>.m_rc = 0;
    local_58.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__AllOf_001816c8;
    local_48.m_caseSensitivity = Yes;
    local_48._4_4_ = 0;
    local_48.m_str._M_dataplus._M_p = (pointer)0x0;
    local_48.m_str._M_string_length = 0;
    captureExpectedException(this,&local_58);
    local_58.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__AllOf_001816c8;
    std::
    vector<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&local_48);
  }
  else {
    local_58.super_SharedImpl<Catch::IShared>.m_rc = 0;
    local_58.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__Equals_00180110;
    local_48._0_8_ = local_48._0_8_ & 0xffffffff00000000;
    Matchers::Impl::StdString::CasedString::adjustString(&local_48.m_str,&local_48,expectedMessage);
    captureExpectedException(this,&local_58);
    local_58.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__Equals_00180110;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.m_str._M_dataplus._M_p != &local_48.m_str.field_2) {
      operator_delete(local_48.m_str._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException(std::string const& expectedMessage) {
		if (expectedMessage.empty())
			captureExpectedException(Matchers::Impl::Generic::AllOf<std::string>());
		else
			captureExpectedException(Matchers::Equals(expectedMessage));
	}